

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O2

void menu_item_translate_coordinates_proc
               (Am_Object *obj,Am_Object *for_part,int in_x,int in_y,int *out_x,int *out_y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  
  bVar1 = Am_Object::Valid(for_part);
  if (bVar1) {
    pAVar7 = Am_Object::Get(obj,0x1cd,7);
    iVar2 = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(obj,0x1cb,7);
    iVar3 = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(for_part,100,7);
    iVar4 = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(for_part,0x65,7);
    iVar5 = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(obj,100,0);
    iVar6 = Am_Value::operator_cast_to_int(pAVar7);
    *out_x = ((iVar2 + in_x) - iVar4) + iVar6;
    pAVar7 = Am_Object::Get(obj,0x65,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar7);
    iVar2 = (iVar3 - iVar5) + iVar2;
  }
  else {
    pAVar7 = Am_Object::Get(obj,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar7);
    *out_x = iVar2 + in_x;
    pAVar7 = Am_Object::Get(obj,0x65,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  }
  *out_y = iVar2 + in_y;
  return;
}

Assistant:

Am_Define_Method(Am_Translate_Coordinates_Method, void,
                 menu_item_translate_coordinates,
                 (const Am_Object &obj, const Am_Object &for_part, int in_x,
                  int in_y, int &out_x, int &out_y))
{
  if (for_part.Valid()) {
    const Am_Slot_Flags flags = Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR;
    int display_left = obj.Get(Am_MENU_ITEM_LEFT_OFFSET, flags);
    int display_top = obj.Get(Am_MENU_ITEM_TOP_OFFSET, flags);
    int part_left = for_part.Get(Am_LEFT, flags);
    int part_top = for_part.Get(Am_TOP, flags);
    out_x = (int)obj.Get(Am_LEFT) + display_left - part_left + in_x;
    out_y = (int)obj.Get(Am_TOP) + display_top - part_top + in_y;
  } else {
    out_x = (int)obj.Get(Am_LEFT) + in_x;
    out_y = (int)obj.Get(Am_TOP) + in_y;
  }
}